

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

string * __thiscall
upb::generator::(anonymous_namespace)::MessageMiniTableRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,MessageDefPtr descriptor,
          Options *options)

{
  char *pcVar1;
  string_view full_name;
  string_view full_name_00;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  string local_140;
  AlphaNum local_120;
  AlphaNum local_f0;
  AlphaNum local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  string local_70;
  AlphaNum local_50;
  upb_MessageDef *local_20;
  Options *options_local;
  MessageDefPtr descriptor_local;
  
  local_20 = descriptor.ptr_;
  options_local = (Options *)this;
  descriptor_local.ptr_ = (upb_MessageDef *)__return_storage_ptr__;
  if (*(int *)&(descriptor.ptr_)->opts == 0) {
    pcVar1 = MessageDefPtr::full_name((MessageDefPtr *)&options_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,pcVar1);
    full_name._M_str = (char *)options;
    full_name._M_len = (size_t)local_80._M_str;
    MiniTableMessageVarName_abi_cxx11_(&local_70,(generator *)local_80._M_len,full_name);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_50,&local_70);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_c0,"()");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_f0,"&");
    pcVar1 = MessageDefPtr::full_name((MessageDefPtr *)&options_local);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,pcVar1);
    full_name_00._M_str = (char *)options;
    full_name_00._M_len = (size_t)local_150._M_str;
    MiniTableMessageVarName_abi_cxx11_(&local_140,(generator *)local_150._M_len,full_name_00);
    absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_120,&local_140);
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)__return_storage_ptr__,&local_f0);
    std::__cxx11::string::~string((string *)&local_140);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageMiniTableRef(upb::MessageDefPtr descriptor,
                                const Options& options) {
  if (options.bootstrap_stage == 0) {
    return absl::StrCat(MiniTableMessageVarName(descriptor.full_name()), "()");
  } else {
    return absl::StrCat("&", MiniTableMessageVarName(descriptor.full_name()));
  }
}